

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

double ** multiply_matrix(double **x,int m,int n,double **y,int v,int b)

{
  double *pdVar1;
  double *pdVar2;
  double **ppdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  string local_50;
  
  ppdVar3 = matrix(1,(long)m,1,(long)b);
  if (n == v) {
    if (0 < m) {
      uVar4 = 1;
      do {
        if (0 < b) {
          memset(ppdVar3[uVar4] + 1,0,(ulong)(uint)b << 3);
        }
        uVar4 = uVar4 + 1;
      } while (m + 1 != uVar4);
    }
    if (0 < m) {
      uVar4 = 1;
      do {
        if (0 < b) {
          uVar5 = 1;
          do {
            if (0 < v) {
              pdVar1 = x[uVar4];
              pdVar2 = ppdVar3[uVar4];
              dVar7 = pdVar2[uVar5];
              uVar6 = 1;
              do {
                dVar7 = dVar7 + pdVar1[uVar6] * y[uVar6][uVar5];
                pdVar2[uVar5] = dVar7;
                uVar6 = uVar6 + 1;
              } while (v + 1 != uVar6);
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 != b + 1);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != m + 1);
    }
    return ppdVar3;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"bad dimensions in mulitply_matrix()","");
  nrerror(&local_50);
}

Assistant:

double **multiply_matrix(double **x, int m, int n, double **y, int v, int b) {
    int k, l, j;
    double **tmp;

    tmp = matrix(1, m, 1, b);
    if (n != v) nrerror("bad dimensions in mulitply_matrix()");
    for (k = 1; k <= m; k++)
        for (l = 1; l <= b; l++)
            tmp[k][l] = 0;

    for (k = 1; k <= m; k++) {     /* row of x */
        for (l = 1; l <= b; l++) {    /* column of x */

            for (j = 1; j <= v; j++) {
                tmp[k][l] += x[k][j] * y[j][l];
            }
        }
    }
    return tmp;
}